

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Interpolater.cpp
# Opt level: O1

void __thiscall
amrex::FaceDivFree::interp_arr
          (FaceDivFree *this,Array<FArrayBox_*,_3> *crse,int crse_comp,Array<FArrayBox_*,_3> *fine,
          int fine_comp,int ncomp,Box *fine_region,IntVect *ratio,Array<IArrayBox_*,_3> *solve_mask,
          Geometry *param_9,Geometry *fine_geom,
          Vector<std::array<amrex::BCRec,_3UL>,_std::allocator<std::array<amrex::BCRec,_3UL>_>_>
          *param_11,int param_12,int param_13,RunOn runon)

{
  long lVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  undefined4 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  double dVar20;
  undefined8 uVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  int iVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  int *piVar38;
  uint uVar39;
  uint uVar40;
  long lVar41;
  long lVar42;
  ulong uVar43;
  long lVar44;
  int iVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  int *piVar52;
  long lVar53;
  int iVar54;
  long lVar55;
  long lVar56;
  long lVar57;
  long lVar58;
  long lVar59;
  long lVar60;
  long lVar61;
  int iVar62;
  long lVar63;
  long lVar64;
  long lVar65;
  int iVar66;
  int iVar67;
  long lVar68;
  long lVar69;
  bool bVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  double dVar93;
  double dVar94;
  double dVar95;
  double dVar96;
  Box c_fine_region;
  Box bx_2;
  Box bx_1;
  Box bx;
  Array<IndexType,_3> types;
  GpuArray<amrex::Array4<double>,_3U> finearr;
  GpuArray<amrex::Array4<const_double>,_3U> crsearr;
  GpuArray<amrex::Array4<const_int>,_3U> maskarr;
  long local_668;
  int *local_658;
  int *local_650;
  long local_648;
  int *local_640;
  long local_638;
  long local_630;
  long local_628;
  long local_620;
  undefined8 local_618;
  uint uStack_610;
  uint auStack_60c [2];
  undefined8 uStack_604;
  long local_5e0;
  long local_5d8;
  long local_5d0;
  long local_5c8;
  long local_5a8;
  long local_5a0;
  ulong local_588;
  int local_55c;
  long local_558;
  long local_548;
  int local_4f4;
  int local_4f0;
  int local_4ec;
  long local_4e8;
  int *local_4d8;
  int *local_4c8;
  long local_4b8;
  double dStack_4b0;
  long local_4a8;
  undefined8 uStack_4a0;
  int *local_498;
  long local_488;
  double dStack_480;
  long local_478;
  long local_468;
  uint local_42c [2];
  undefined8 uStack_424;
  uint local_40c [2];
  undefined8 uStack_404;
  uint local_3ec [2];
  undefined8 uStack_3e4;
  ulong local_3d8;
  long local_3d0;
  long local_3b8;
  uint local_3a8 [14];
  long local_370;
  long local_368;
  long local_360;
  long local_358;
  long local_350;
  long local_348;
  undefined1 local_340 [8];
  undefined1 local_338 [12];
  undefined8 auStack_32c [3];
  undefined4 uStack_314;
  long local_310 [4];
  int local_2f0 [3];
  ulong uStack_2e4;
  int aiStack_2dc [3];
  long local_2d0;
  long local_2c8;
  long local_2c0;
  long local_2b8;
  int local_2b0;
  int local_2ac;
  int local_2a8;
  long local_290;
  long local_288;
  long local_280;
  long local_278;
  int local_270;
  int local_26c;
  int local_268;
  undefined8 auStack_1dc [5];
  int iStack_1b4;
  undefined8 local_1b0;
  undefined8 local_1a8;
  long local_1a0 [2];
  int local_190 [3];
  ulong uStack_184;
  int aiStack_17c [3];
  long local_170;
  long local_168;
  long local_160;
  long local_158;
  uint local_150;
  int local_14c;
  uint local_148;
  long local_130;
  long local_128;
  undefined1 local_120 [8];
  undefined1 local_118 [8];
  uint local_110;
  uint local_10c;
  int local_108;
  undefined8 auStack_104 [2];
  undefined4 uStack_f4;
  long local_f0 [4];
  int local_d0 [3];
  ulong uStack_c4;
  undefined4 auStack_bc [3];
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  int local_90;
  int local_8c;
  int local_88;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  int local_50;
  int local_4c;
  int local_48;
  
  local_588 = CONCAT44(local_588._4_4_,ncomp);
  local_3a8[2] = 0;
  local_3a8[0] = 0;
  local_3a8[1] = 0;
  lVar35 = 0;
  do {
    local_3a8[lVar35] = local_3a8[lVar35] | 1 << ((byte)lVar35 & 0x1f);
    lVar35 = lVar35 + 1;
  } while (lVar35 != 3);
  if (((ratio->vect[0] != 2) || (ratio->vect[1] != 2)) || (ratio->vect[2] != 2)) {
    Assert_host("ratio == 2",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/AmrCore/AMReX_Interpolater.cpp"
                ,0x3a5,(char *)0x0);
  }
  lVar35 = *(long *)(fine_region->smallend).vect;
  lVar29 = *(long *)((fine_region->smallend).vect + 2);
  lVar30 = *(long *)(fine_region->bigend).vect;
  uVar21 = *(undefined8 *)((fine_region->bigend).vect + 2);
  auStack_60c[1] = (uint)((ulong)lVar30 >> 0x20);
  uStack_604 = uVar21;
  uStack_610 = (uint)lVar29;
  auStack_60c[0] = (uint)((ulong)lVar29 >> 0x20);
  iVar28 = ratio->vect[0];
  iVar62 = ratio->vect[1];
  if (((iVar28 == 1) && (iVar62 == 1)) && (local_618 = lVar35, ratio->vect[2] == 1))
  goto LAB_005ba6ea;
  local_618._0_4_ = (uint)lVar35;
  if (iVar28 != 1) {
    if (iVar28 == 4) {
      if ((int)(uint)local_618 < 0) {
        local_618._0_4_ = (uint)local_618 + 1;
        uVar39 = -(uint)local_618;
        if (0 < (int)(uint)local_618) {
          uVar39 = (uint)local_618;
        }
        uVar39 = uVar39 >> 2;
LAB_005ba433:
        local_618._0_4_ = ~uVar39;
      }
      else {
        local_618._0_4_ = (uint)local_618 >> 2;
      }
    }
    else if (iVar28 == 2) {
      if ((int)(uint)local_618 < 0) {
        local_618._0_4_ = (uint)local_618 + 1;
        uVar39 = -(uint)local_618;
        if (0 < (int)(uint)local_618) {
          uVar39 = (uint)local_618;
        }
        uVar39 = uVar39 >> 1;
        goto LAB_005ba433;
      }
      local_618._0_4_ = (uint)local_618 >> 1;
    }
    else if ((int)(uint)local_618 < 0) {
      iVar54 = (uint)local_618 + 1;
      iVar45 = -iVar54;
      if (0 < iVar54) {
        iVar45 = iVar54;
      }
      local_618._0_4_ = ~(iVar45 / iVar28);
    }
    else {
      local_618._0_4_ = (int)(uint)local_618 / iVar28;
    }
  }
  local_618._4_4_ = (uint)((ulong)lVar35 >> 0x20);
  if (iVar62 != 1) {
    if (iVar62 == 4) {
      if (lVar35 < 0) {
        local_618._4_4_ = local_618._4_4_ + 1;
        uVar39 = -local_618._4_4_;
        if (0 < (int)local_618._4_4_) {
          uVar39 = local_618._4_4_;
        }
        uVar39 = uVar39 >> 2;
LAB_005ba493:
        local_618._4_4_ = ~uVar39;
      }
      else {
        local_618._4_4_ = local_618._4_4_ >> 2;
      }
    }
    else if (iVar62 == 2) {
      if (lVar35 < 0) {
        local_618._4_4_ = local_618._4_4_ + 1;
        uVar39 = -local_618._4_4_;
        if (0 < (int)local_618._4_4_) {
          uVar39 = local_618._4_4_;
        }
        uVar39 = uVar39 >> 1;
        goto LAB_005ba493;
      }
      local_618._4_4_ = local_618._4_4_ >> 1;
    }
    else if (lVar35 < 0) {
      iVar54 = local_618._4_4_ + 1;
      iVar45 = -iVar54;
      if (0 < iVar54) {
        iVar45 = iVar54;
      }
      local_618._4_4_ = ~(iVar45 / iVar62);
    }
    else {
      local_618._4_4_ = (int)local_618._4_4_ / iVar62;
    }
  }
  iVar45 = ratio->vect[2];
  if (iVar45 != 1) {
    if (iVar45 == 4) {
      if ((int)uStack_610 < 0) {
        uStack_610 = uStack_610 + 1;
        uVar39 = -uStack_610;
        if (0 < (int)uStack_610) {
          uVar39 = uStack_610;
        }
        uVar39 = uVar39 >> 2;
LAB_005ba4f7:
        uStack_610 = ~uVar39;
      }
      else {
        uStack_610 = uStack_610 >> 2;
      }
    }
    else if (iVar45 == 2) {
      if ((int)uStack_610 < 0) {
        uStack_610 = uStack_610 + 1;
        uVar39 = -uStack_610;
        if (0 < (int)uStack_610) {
          uVar39 = uStack_610;
        }
        uVar39 = uVar39 >> 1;
        goto LAB_005ba4f7;
      }
      uStack_610 = uStack_610 >> 1;
    }
    else if ((int)uStack_610 < 0) {
      iVar66 = uStack_610 + 1;
      iVar54 = -iVar66;
      if (0 < iVar66) {
        iVar54 = iVar66;
      }
      uStack_610 = ~(iVar54 / iVar45);
    }
    else {
      uStack_610 = (int)uStack_610 / iVar45;
    }
  }
  uStack_604._4_4_ = (uint)((ulong)uVar21 >> 0x20);
  uStack_604._0_4_ = (uint)uVar21;
  if (uStack_604._4_4_ == 0) {
    if (iVar28 != 1) {
      if (iVar28 == 4) {
        if (lVar29 < 0) {
          auStack_60c[0] = auStack_60c[0] + 1;
          uVar39 = -auStack_60c[0];
          if (0 < (int)auStack_60c[0]) {
            uVar39 = auStack_60c[0];
          }
          uVar39 = uVar39 >> 2;
LAB_005bd05d:
          auStack_60c[0] = ~uVar39;
        }
        else {
          auStack_60c[0] = auStack_60c[0] >> 2;
        }
      }
      else if (iVar28 == 2) {
        if (lVar29 < 0) {
          auStack_60c[0] = auStack_60c[0] + 1;
          uVar39 = -auStack_60c[0];
          if (0 < (int)auStack_60c[0]) {
            uVar39 = auStack_60c[0];
          }
          uVar39 = uVar39 >> 1;
          goto LAB_005bd05d;
        }
        auStack_60c[0] = auStack_60c[0] >> 1;
      }
      else if (lVar29 < 0) {
        iVar66 = auStack_60c[0] + 1;
        iVar54 = -iVar66;
        if (0 < iVar66) {
          iVar54 = iVar66;
        }
        auStack_60c[0] = ~(iVar54 / iVar28);
      }
      else {
        auStack_60c[0] = (int)auStack_60c[0] / iVar28;
      }
    }
    if (iVar62 != 1) {
      if (iVar62 == 4) {
        if (lVar30 < 0) {
          auStack_60c[1] = auStack_60c[1] + 1;
          uVar39 = -auStack_60c[1];
          if (0 < (int)auStack_60c[1]) {
            uVar39 = auStack_60c[1];
          }
          uVar39 = uVar39 >> 2;
LAB_005bd0bd:
          auStack_60c[1] = ~uVar39;
        }
        else {
          auStack_60c[1] = auStack_60c[1] >> 2;
        }
      }
      else if (iVar62 == 2) {
        if (lVar30 < 0) {
          auStack_60c[1] = auStack_60c[1] + 1;
          uVar39 = -auStack_60c[1];
          if (0 < (int)auStack_60c[1]) {
            uVar39 = auStack_60c[1];
          }
          uVar39 = uVar39 >> 1;
          goto LAB_005bd0bd;
        }
        auStack_60c[1] = auStack_60c[1] >> 1;
      }
      else if (lVar30 < 0) {
        iVar54 = auStack_60c[1] + 1;
        iVar28 = -iVar54;
        if (0 < iVar54) {
          iVar28 = iVar54;
        }
        auStack_60c[1] = ~(iVar28 / iVar62);
      }
      else {
        auStack_60c[1] = (int)auStack_60c[1] / iVar62;
      }
    }
    if (iVar45 != 1) {
      if (iVar45 == 4) {
        if ((int)(uint)uStack_604 < 0) {
          uStack_604._0_4_ = (uint)uStack_604 + 1;
          uVar39 = -(uint)uStack_604;
          if (0 < (int)(uint)uStack_604) {
            uVar39 = (uint)uStack_604;
          }
          uVar39 = uVar39 >> 2;
LAB_005bd12a:
          uStack_604._0_4_ = ~uVar39;
        }
        else {
          uStack_604._0_4_ = (uint)uStack_604 >> 2;
        }
      }
      else if (iVar45 == 2) {
        if ((int)(uint)uStack_604 < 0) {
          uStack_604._0_4_ = (uint)uStack_604 + 1;
          uVar39 = -(uint)uStack_604;
          if (0 < (int)(uint)uStack_604) {
            uVar39 = (uint)uStack_604;
          }
          uVar39 = uVar39 >> 1;
          goto LAB_005bd12a;
        }
        uStack_604._0_4_ = (uint)uStack_604 >> 1;
      }
      else if ((int)(uint)uStack_604 < 0) {
        iVar62 = (uint)uStack_604 + 1;
        iVar28 = -iVar62;
        if (0 < iVar62) {
          iVar28 = iVar62;
        }
        uStack_604._0_4_ = ~(iVar28 / iVar45);
      }
      else {
        uStack_604._0_4_ = (int)(uint)uStack_604 / iVar45;
      }
    }
  }
  else {
    local_1b0 = 0;
    local_1a8._0_4_ = 0;
    lVar35 = 0;
    do {
      if (((uStack_604._4_4_ >> ((uint)lVar35 & 0x1f) & 1) != 0) &&
         ((int)auStack_60c[lVar35] % ratio->vect[lVar35] != 0)) {
        *(undefined4 *)((long)&local_1b0 + lVar35 * 4) = 1;
      }
      lVar35 = lVar35 + 1;
    } while (lVar35 != 3);
    if (iVar28 != 1) {
      if (iVar28 == 4) {
        if (lVar29 < 0) {
          auStack_60c[0] = auStack_60c[0] + 1;
          uVar39 = -auStack_60c[0];
          if (0 < (int)auStack_60c[0]) {
            uVar39 = auStack_60c[0];
          }
          uVar39 = uVar39 >> 2;
LAB_005ba5f1:
          auStack_60c[0] = ~uVar39;
        }
        else {
          auStack_60c[0] = auStack_60c[0] >> 2;
        }
      }
      else if (iVar28 == 2) {
        if (lVar29 < 0) {
          auStack_60c[0] = auStack_60c[0] + 1;
          uVar39 = -auStack_60c[0];
          if (0 < (int)auStack_60c[0]) {
            uVar39 = auStack_60c[0];
          }
          uVar39 = uVar39 >> 1;
          goto LAB_005ba5f1;
        }
        auStack_60c[0] = auStack_60c[0] >> 1;
      }
      else if (lVar29 < 0) {
        iVar66 = auStack_60c[0] + 1;
        iVar54 = -iVar66;
        if (0 < iVar66) {
          iVar54 = iVar66;
        }
        auStack_60c[0] = ~(iVar54 / iVar28);
      }
      else {
        auStack_60c[0] = (int)auStack_60c[0] / iVar28;
      }
    }
    if (iVar62 != 1) {
      if (iVar62 == 4) {
        if (lVar30 < 0) {
          auStack_60c[1] = auStack_60c[1] + 1;
          uVar39 = -auStack_60c[1];
          if (0 < (int)auStack_60c[1]) {
            uVar39 = auStack_60c[1];
          }
          uVar39 = uVar39 >> 2;
LAB_005ba653:
          auStack_60c[1] = ~uVar39;
        }
        else {
          auStack_60c[1] = auStack_60c[1] >> 2;
        }
      }
      else if (iVar62 == 2) {
        if (lVar30 < 0) {
          auStack_60c[1] = auStack_60c[1] + 1;
          uVar39 = -auStack_60c[1];
          if (0 < (int)auStack_60c[1]) {
            uVar39 = auStack_60c[1];
          }
          uVar39 = uVar39 >> 1;
          goto LAB_005ba653;
        }
        auStack_60c[1] = auStack_60c[1] >> 1;
      }
      else if (lVar30 < 0) {
        iVar54 = auStack_60c[1] + 1;
        iVar28 = -iVar54;
        if (0 < iVar54) {
          iVar28 = iVar54;
        }
        auStack_60c[1] = ~(iVar28 / iVar62);
      }
      else {
        auStack_60c[1] = (int)auStack_60c[1] / iVar62;
      }
    }
    if (iVar45 != 1) {
      if (iVar45 == 4) {
        if ((int)(uint)uStack_604 < 0) {
          uStack_604._0_4_ = (uint)uStack_604 + 1;
          uVar39 = -(uint)uStack_604;
          if (0 < (int)(uint)uStack_604) {
            uVar39 = (uint)uStack_604;
          }
          uVar39 = uVar39 >> 2;
LAB_005ba6b3:
          uStack_604._0_4_ = ~uVar39;
        }
        else {
          uStack_604._0_4_ = (uint)uStack_604 >> 2;
        }
      }
      else if (iVar45 == 2) {
        if ((int)(uint)uStack_604 < 0) {
          uStack_604._0_4_ = (uint)uStack_604 + 1;
          uVar39 = -(uint)uStack_604;
          if (0 < (int)(uint)uStack_604) {
            uVar39 = (uint)uStack_604;
          }
          uVar39 = uVar39 >> 1;
          goto LAB_005ba6b3;
        }
        uStack_604._0_4_ = (uint)uStack_604 >> 1;
      }
      else if ((int)(uint)uStack_604 < 0) {
        iVar62 = (uint)uStack_604 + 1;
        iVar28 = -iVar62;
        if (0 < iVar62) {
          iVar28 = iVar62;
        }
        uStack_604._0_4_ = ~(iVar28 / iVar45);
      }
      else {
        uStack_604._0_4_ = (int)(uint)uStack_604 / iVar45;
      }
    }
    auStack_60c[0] = auStack_60c[0] + (int)local_1b0;
    auStack_60c[1] = auStack_60c[1] + local_1b0._4_4_;
    uStack_604._0_4_ = (uint)uStack_604 + (int)local_1a8;
  }
LAB_005ba6ea:
  dVar80 = (fine_geom->super_CoordSys).dx[0];
  dVar71 = (fine_geom->super_CoordSys).dx[1];
  dVar87 = (fine_geom->super_CoordSys).dx[2];
  lVar35 = 0x2c;
  do {
    *(undefined8 *)((long)auStack_1dc + lVar35 + 0x10) = 0;
    *(undefined8 *)((long)auStack_1dc + lVar35 + 0x18) = 0;
    *(undefined8 *)((long)auStack_1dc + lVar35) = 0;
    *(undefined8 *)((long)auStack_1dc + lVar35 + 8) = 0;
    *(undefined8 *)((long)auStack_1dc + lVar35 + 0x20) = 0x100000001;
    *(undefined4 *)((long)&iStack_1b4 + lVar35) = 1;
    *(undefined8 *)((long)&local_1b0 + lVar35) = 0;
    *(undefined8 *)((long)&local_1a8 + lVar35) = 0;
    lVar35 = lVar35 + 0x40;
  } while (lVar35 != 0xec);
  lVar35 = 0x2c;
  do {
    *(undefined8 *)((long)auStack_32c + lVar35) = 0;
    *(undefined8 *)((long)auStack_32c + lVar35 + 8) = 0;
    *(undefined8 *)(local_340 + lVar35 + 4) = 0;
    *(undefined8 *)(local_338 + lVar35 + 4) = 0;
    *(undefined8 *)((long)auStack_32c + lVar35 + 0x10) = 0x100000001;
    *(undefined4 *)((long)&uStack_314 + lVar35) = 1;
    *(undefined8 *)((long)local_310 + lVar35) = 0;
    *(undefined8 *)((long)local_310 + lVar35 + 8) = 0;
    lVar35 = lVar35 + 0x40;
  } while (lVar35 != 0xec);
  lVar35 = 0x2c;
  do {
    *(undefined8 *)((long)&local_10c + lVar35) = 0;
    *(undefined8 *)((long)auStack_104 + lVar35) = 0;
    *(undefined8 *)(local_120 + lVar35 + 4) = 0;
    *(undefined8 *)(local_118 + lVar35 + 4) = 0;
    *(undefined8 *)((long)auStack_104 + lVar35 + 8) = 0x100000001;
    *(undefined4 *)((long)&uStack_f4 + lVar35) = 1;
    *(undefined8 *)((long)local_f0 + lVar35) = 0;
    *(undefined8 *)((long)local_f0 + lVar35 + 8) = 0;
    lVar35 = lVar35 + 0x40;
  } while (lVar35 != 0xec);
  lVar35 = (long)crse_comp;
  lVar29 = (long)fine_comp;
  lVar30 = 0;
  do {
    lVar36 = *(long *)((long)crse->_M_elems + lVar30);
    iVar28 = *(int *)(lVar36 + 0x20);
    uVar21 = *(undefined8 *)(lVar36 + 0x18);
    lVar46 = (long)*(int *)(lVar36 + 0x28) + 1;
    iVar62 = *(int *)(lVar36 + 0x24);
    lVar51 = (long)*(int *)(lVar36 + 0x2c) + 1;
    lVar42 = ((long)iVar62 - (long)*(int *)(lVar36 + 0x18)) + 1;
    lVar47 = (lVar46 - *(int *)(lVar36 + 0x1c)) * lVar42;
    lVar49 = (lVar51 - iVar28) * lVar47;
    iVar45 = *(int *)(lVar36 + 0x34);
    (&local_1b0)[lVar30] = lVar49 * lVar35 * 8 + *(long *)(lVar36 + 0x10);
    (&local_1a8)[lVar30] = lVar42;
    local_1a0[lVar30] = lVar47;
    local_1a0[lVar30 + 1] = lVar49;
    *(undefined8 *)(local_190 + lVar30 * 2) = uVar21;
    local_190[lVar30 * 2 + 2] = iVar28;
    (&uStack_184)[lVar30] = (ulong)(iVar62 + 1) | lVar46 << 0x20;
    aiStack_17c[lVar30 * 2] = (int)lVar51;
    aiStack_17c[lVar30 * 2 + 1] = iVar45 - crse_comp;
    lVar36 = *(long *)((long)fine->_M_elems + lVar30);
    iVar28 = *(int *)(lVar36 + 0x20);
    uVar21 = *(undefined8 *)(lVar36 + 0x18);
    lVar46 = (long)*(int *)(lVar36 + 0x28) + 1;
    iVar62 = *(int *)(lVar36 + 0x24);
    lVar51 = (long)*(int *)(lVar36 + 0x2c) + 1;
    lVar42 = ((long)iVar62 - (long)*(int *)(lVar36 + 0x18)) + 1;
    lVar47 = (lVar46 - *(int *)(lVar36 + 0x1c)) * lVar42;
    lVar49 = (lVar51 - iVar28) * lVar47;
    iVar45 = *(int *)(lVar36 + 0x34);
    local_310[lVar30] = lVar49 * lVar29 * 8 + *(long *)(lVar36 + 0x10);
    local_310[lVar30 + 1] = lVar42;
    local_310[lVar30 + 2] = lVar47;
    local_310[lVar30 + 3] = lVar49;
    *(undefined8 *)(local_2f0 + lVar30 * 2) = uVar21;
    local_2f0[lVar30 * 2 + 2] = iVar28;
    (&uStack_2e4)[lVar30] = (ulong)(iVar62 + 1) | lVar46 << 0x20;
    aiStack_2dc[lVar30 * 2] = (int)lVar51;
    aiStack_2dc[lVar30 * 2 + 1] = iVar45 - fine_comp;
    lVar36 = *(long *)((long)solve_mask->_M_elems + lVar30);
    if (lVar36 != 0) {
      uVar14 = *(undefined4 *)(lVar36 + 0x34);
      iVar28 = *(int *)(lVar36 + 0x20);
      uVar21 = *(undefined8 *)(lVar36 + 0x18);
      lVar42 = (long)*(int *)(lVar36 + 0x28) + 1;
      iVar62 = *(int *)(lVar36 + 0x24);
      lVar47 = (long)*(int *)(lVar36 + 0x2c) + 1;
      lVar49 = ((long)iVar62 - (long)*(int *)(lVar36 + 0x18)) + 1;
      lVar46 = (lVar42 - *(int *)(lVar36 + 0x1c)) * lVar49;
      local_f0[lVar30] = *(long *)(lVar36 + 0x10);
      local_f0[lVar30 + 1] = lVar49;
      local_f0[lVar30 + 2] = lVar46;
      local_f0[lVar30 + 3] = (lVar47 - iVar28) * lVar46;
      *(undefined8 *)(local_d0 + lVar30 * 2) = uVar21;
      local_d0[lVar30 * 2 + 2] = iVar28;
      (&uStack_c4)[lVar30] = (ulong)(iVar62 + 1) | lVar42 << 0x20;
      auStack_bc[lVar30 * 2] = (int)lVar47;
      auStack_bc[lVar30 * 2 + 1] = uVar14;
    }
    lVar30 = lVar30 + 8;
  } while (lVar30 != 0x18);
  local_3ec[1] = auStack_60c[1];
  uStack_3e4 = uStack_604;
  local_3ec[0] = auStack_60c[0];
  lVar30 = 0;
  do {
    uVar40 = 1 << ((byte)lVar30 & 0x1f);
    uVar39 = (uint)lVar30;
    local_3ec[lVar30] =
         (local_3ec[lVar30] + (uint)((local_3a8[0] >> (uVar39 & 0x1f) & 1) != 0)) -
         (uint)((uStack_3e4._4_4_ >> (uVar39 & 0x1f) & 1) != 0);
    if ((local_3a8[0] >> (uVar39 & 0x1f) & 1) == 0) {
      uVar40 = ~uVar40 & uStack_3e4._4_4_;
    }
    else {
      uVar40 = uVar40 | uStack_3e4._4_4_;
    }
    uStack_3e4 = CONCAT44(uVar40,(int)uStack_3e4);
    lVar30 = lVar30 + 1;
  } while (lVar30 != 3);
  local_40c[1] = auStack_60c[1];
  uStack_404 = uStack_604;
  local_40c[0] = auStack_60c[0];
  lVar30 = 0;
  do {
    uVar40 = 1 << ((byte)lVar30 & 0x1f);
    uVar39 = (uint)lVar30;
    local_40c[lVar30] =
         (local_40c[lVar30] + (uint)((local_3a8[1] >> (uVar39 & 0x1f) & 1) != 0)) -
         (uint)((uStack_404._4_4_ >> (uVar39 & 0x1f) & 1) != 0);
    if ((local_3a8[1] >> (uVar39 & 0x1f) & 1) == 0) {
      uVar40 = ~uVar40 & uStack_404._4_4_;
    }
    else {
      uVar40 = uVar40 | uStack_404._4_4_;
    }
    uStack_404 = CONCAT44(uVar40,(int)uStack_404);
    lVar30 = lVar30 + 1;
  } while (lVar30 != 3);
  local_42c[1] = auStack_60c[1];
  uStack_424 = uStack_604;
  local_42c[0] = auStack_60c[0];
  lVar30 = 0;
  do {
    uVar40 = 1 << ((byte)lVar30 & 0x1f);
    uVar39 = (uint)lVar30;
    local_42c[lVar30] =
         (local_42c[lVar30] + (uint)((local_3a8[2] >> (uVar39 & 0x1f) & 1) != 0)) -
         (uint)((uStack_424._4_4_ >> (uVar39 & 0x1f) & 1) != 0);
    if ((local_3a8[2] >> (uVar39 & 0x1f) & 1) == 0) {
      uVar40 = ~uVar40 & uStack_424._4_4_;
    }
    else {
      uVar40 = uVar40 | uStack_424._4_4_;
    }
    uStack_424 = CONCAT44(uVar40,(int)uStack_424);
    lVar30 = lVar30 + 1;
  } while (lVar30 != 3);
  local_668 = (long)(int)uStack_610;
  uVar31 = local_588 & 0xffffffff;
  if ((int)uStack_610 <= (int)uStack_3e4) {
    lVar46 = (long)(int)local_618._4_4_;
    lVar59 = (long)(int)(uint)local_618;
    lVar36 = (long)local_190[0];
    lVar30 = lVar59 * 8 + local_1a0[1] * lVar35 * 8;
    lVar47 = (local_668 - local_190[2]) * local_1a0[0];
    lVar49 = (lVar46 - local_190[1]) * CONCAT44(local_1a8._4_4_,(int)local_1a8);
    lVar42 = lVar30 + lVar36 * -8 + local_1b0;
    local_5a0 = lVar30 + lVar47 * 8 + lVar36 * -8 + local_1b0;
    lVar51 = lVar30 + lVar49 * 8 + lVar36 * -8 + local_1b0;
    local_648 = lVar47 * 8 + lVar49 * 8 + lVar30 + lVar36 * -8 + local_1b0;
    local_658 = (int *)((local_668 - local_d0[2]) * local_f0[2] * 4 +
                        (lVar46 - local_d0[1]) * local_f0[1] * 4 + local_f0[3] * lVar35 * 4 +
                        lVar59 * 4 + (long)local_d0[0] * -4 + local_f0[0]);
    lVar30 = local_1a0[0] * 8;
    iVar28 = uStack_610 - local_190[2];
    lVar36 = CONCAT44(local_1a8._4_4_,(int)local_1a8) * 8;
    iVar62 = ~local_190[2] + uStack_610;
    do {
      iVar28 = iVar28 + 1;
      if ((int)local_618._4_4_ <= (int)local_3ec[1]) {
        local_5e0 = lVar51 + iVar28 * lVar30;
        local_558 = lVar51 + iVar62 * lVar30;
        lVar47 = iVar28 * lVar30 + lVar42;
        lVar49 = iVar62 * lVar30 + lVar42;
        local_650 = (int *)local_648;
        local_4d8 = local_658;
        local_4a8 = lVar46;
        iVar45 = ~local_190[1] + local_618._4_4_;
        iVar54 = local_618._4_4_ - local_190[1];
        do {
          iVar54 = iVar54 + 1;
          if ((int)(uint)local_618 <= (int)local_3ec[0]) {
            local_468 = iVar54 * lVar36;
            local_478 = lVar47 + local_468;
            local_5c8 = local_5a0 + local_468;
            local_468 = local_468 + lVar49;
            lVar50 = iVar45 * lVar36;
            local_5d0 = lVar47 + lVar50;
            lVar44 = local_5a0 + lVar50;
            lVar50 = lVar50 + lVar49;
            local_4c8 = local_4d8;
            lVar32 = local_5e0;
            lVar41 = local_558;
            piVar52 = local_650;
            local_548 = lVar59;
            do {
              if (0 < (int)local_588) {
                lVar37 = (long)local_2f0[0];
                local_488 = (long)local_2f0[1];
                iVar66 = ratio->vect[2] * (int)local_668;
                lVar61 = lVar29 * 8 * local_310[3];
                lVar60 = (long)((iVar66 - local_2f0[2]) + 1) * local_310[2] * 8 + lVar61;
                iVar67 = ratio->vect[1] * (int)local_4a8;
                lVar61 = ((long)iVar66 - (long)local_2f0[2]) * local_310[2] * 8 + lVar61;
                lVar58 = (long)(ratio->vect[0] * (int)local_548);
                lVar68 = (long)((iVar67 - local_2f0[1]) + 1) * local_310[1] * 8;
                lVar64 = ((long)iVar67 - (long)local_2f0[1]) * local_310[1] * 8;
                lVar55 = lVar60 + lVar68 + lVar37 * -8 + local_310[0];
                lVar48 = local_310[3] * 8;
                lVar68 = lVar68 + lVar61 + lVar37 * -8 + local_310[0];
                lVar60 = lVar60 + lVar64 + lVar37 * -8 + local_310[0];
                lVar61 = lVar64 + lVar61 + lVar37 * -8 + local_310[0];
                lVar37 = 0;
                piVar38 = local_4c8;
                uVar43 = uVar31;
                do {
                  if ((local_f0[0] == 0) || (*piVar38 != 0)) {
                    dVar82 = *(double *)(lVar50 + lVar37);
                    dVar77 = *(double *)(lVar44 + lVar37);
                    dVar86 = *(double *)(local_5d0 + lVar37);
                    dVar4 = *(double *)(lVar41 + lVar37);
                    dVar94 = *(double *)(lVar32 + lVar37);
                    dVar74 = *(double *)(local_468 + lVar37);
                    dVar79 = *(double *)(local_5c8 + lVar37);
                    dVar81 = *(double *)(local_478 + lVar37);
                    dVar83 = *(double *)((long)piVar52 + lVar37) * 64.0;
                    dVar88 = ((dVar82 + dVar81) - dVar74) - dVar86;
                    *(double *)(lVar61 + lVar58 * 8) =
                         ((((dVar77 + dVar4) - dVar79) - dVar94) * 8.0 + dVar83 + dVar88) * 0.015625
                    ;
                    dVar81 = ((dVar86 + dVar74) - dVar82) - dVar81;
                    *(double *)(lVar60 + lVar58 * 8) =
                         ((((dVar77 + dVar94) - dVar79) - dVar4) * 8.0 + dVar83 + dVar81) * 0.015625
                    ;
                    *(double *)(lVar68 + lVar58 * 8) =
                         ((((dVar4 + dVar79) - dVar77) - dVar94) * 8.0 + dVar83 + dVar81) * 0.015625
                    ;
                    *(double *)(lVar55 + lVar58 * 8) =
                         ((((dVar94 + dVar79) - dVar77) - dVar4) * 8.0 + dVar83 + dVar88) * 0.015625
                    ;
                  }
                  lVar55 = lVar55 + lVar48;
                  lVar68 = lVar68 + lVar48;
                  lVar60 = lVar60 + lVar48;
                  lVar61 = lVar61 + lVar48;
                  piVar38 = piVar38 + local_f0[3];
                  lVar37 = lVar37 + local_1a0[1] * 8;
                  uVar43 = uVar43 - 1;
                } while (uVar43 != 0);
              }
              local_548 = local_548 + 1;
              local_4c8 = local_4c8 + 1;
              local_478 = local_478 + 8;
              local_5c8 = local_5c8 + 8;
              local_468 = local_468 + 8;
              lVar32 = lVar32 + 8;
              piVar52 = (int *)((long)piVar52 + 8);
              lVar41 = lVar41 + 8;
              local_5d0 = local_5d0 + 8;
              lVar44 = lVar44 + 8;
              lVar50 = lVar50 + 8;
            } while (local_3ec[0] + 1 != (int)local_548);
          }
          lVar44 = local_4a8 + 1;
          local_4d8 = local_4d8 + local_f0[1];
          local_5e0 = local_5e0 + lVar36;
          local_650 = (int *)((long)local_650 + lVar36);
          local_558 = local_558 + lVar36;
          iVar45 = iVar45 + 1;
          local_4a8 = lVar44;
        } while (local_3ec[1] + 1 != (int)lVar44);
      }
      local_668 = local_668 + 1;
      local_658 = local_658 + local_f0[2];
      local_5a0 = local_5a0 + lVar30;
      iVar62 = iVar62 + 1;
      local_648 = local_648 + lVar30;
    } while ((int)uStack_3e4 + 1 != (int)local_668);
  }
  local_558 = (long)(int)uStack_610;
  if ((int)uStack_610 <= (int)uStack_404) {
    lVar46 = (long)(int)local_618._4_4_;
    lVar47 = (long)(int)(uint)local_618;
    lVar30 = local_158 * lVar35 * 8 + (lVar46 - local_14c) * local_168 * 8;
    lVar36 = lVar30 + (local_558 - (int)local_148) * local_160 * 8;
    lVar42 = lVar30 + lVar47 * 8 + (long)(int)local_150 * -8 + local_170;
    local_4e8 = local_170 + lVar36;
    local_4b8 = lVar36 + lVar47 * 8 + (long)(int)local_150 * -8 + local_170;
    local_640 = (int *)((local_558 - local_88) * local_a0 * 4 + (lVar46 - local_8c) * local_a8 * 4 +
                        local_98 * lVar35 * 4 + lVar47 * 4 + (long)local_90 * -4 + local_b0);
    lVar36 = local_160 * 8;
    iVar28 = uStack_610 - local_148;
    lVar49 = local_168 * 8;
    iVar62 = ~local_148 + uStack_610;
    do {
      iVar28 = iVar28 + 1;
      if ((int)local_618._4_4_ <= (int)local_40c[1]) {
        local_5d8 = lVar30 + local_170 + iVar28 * lVar36;
        lVar44 = iVar28 * lVar36 + lVar42;
        local_4d8 = (int *)(lVar30 + local_170 + iVar62 * lVar36);
        lVar59 = iVar62 * lVar36 + lVar42;
        local_5e0 = local_4e8;
        piVar52 = local_640;
        lVar51 = local_4b8;
        local_668 = lVar46;
        do {
          local_488._0_4_ = ((uint)local_618 - local_150) + 1;
          lVar32 = lVar59;
          lVar41 = lVar44;
          lVar50 = lVar51;
          local_548 = lVar47;
          local_498 = piVar52;
          iVar45 = ~local_150 + (uint)local_618;
          if ((int)(uint)local_618 <= (int)local_40c[0]) {
            do {
              if (0 < (int)local_588) {
                lVar37 = (long)(int)local_488;
                lVar48 = (long)iVar45;
                iVar54 = ratio->vect[2] * (int)local_558;
                lVar61 = (long)((iVar54 - local_2a8) + 1) * local_2c0 * 8;
                iVar66 = ratio->vect[0] * (int)local_548;
                lVar64 = (long)((iVar66 - local_2b0) + 1);
                lVar60 = lVar29 * 8 * local_2b8 +
                         ((long)(ratio->vect[1] * (int)local_668) - (long)local_2ac) * local_2c8 * 8
                         + local_2d0;
                lVar55 = ((long)iVar54 - (long)local_2a8) * local_2c0 * 8;
                lVar58 = 0;
                uVar43 = uVar31;
                piVar38 = local_498;
                do {
                  if ((local_b0 == 0) || (*piVar38 != 0)) {
                    dVar82 = *(double *)((long)local_4d8 + lVar48 * 8 + lVar58);
                    dVar77 = *(double *)(lVar32 + lVar58);
                    dVar86 = *(double *)((long)local_4d8 + lVar37 * 8 + lVar58);
                    dVar4 = *(double *)(local_5e0 + lVar48 * 8 + lVar58);
                    dVar94 = *(double *)(local_5e0 + lVar37 * 8 + lVar58);
                    dVar74 = *(double *)(local_5d8 + lVar48 * 8 + lVar58);
                    dVar79 = *(double *)(lVar41 + lVar58);
                    dVar81 = *(double *)(local_5d8 + lVar37 * 8 + lVar58);
                    dVar83 = *(double *)(lVar50 + lVar58) * 64.0;
                    dVar88 = ((dVar82 + dVar81) - dVar74) - dVar86;
                    *(double *)(lVar60 + lVar55 + (long)iVar66 * 8 + (long)local_2b0 * -8) =
                         ((((dVar77 + dVar4) - dVar79) - dVar94) * 8.0 + dVar83 + dVar88) * 0.015625
                    ;
                    dVar81 = ((dVar86 + dVar74) - dVar82) - dVar81;
                    *(double *)(lVar60 + lVar55 + lVar64 * 8) =
                         ((((dVar77 + dVar94) - dVar79) - dVar4) * 8.0 + dVar83 + dVar81) * 0.015625
                    ;
                    *(double *)(lVar60 + lVar61 + (long)iVar66 * 8 + (long)local_2b0 * -8) =
                         ((((dVar4 + dVar79) - dVar77) - dVar94) * 8.0 + dVar83 + dVar81) * 0.015625
                    ;
                    *(double *)(lVar60 + lVar61 + lVar64 * 8) =
                         ((((dVar94 + dVar79) - dVar77) - dVar4) * 8.0 + dVar83 + dVar88) * 0.015625
                    ;
                  }
                  lVar60 = lVar60 + local_2b8 * 8;
                  piVar38 = piVar38 + local_98;
                  lVar58 = lVar58 + local_158 * 8;
                  uVar43 = uVar43 - 1;
                } while (uVar43 != 0);
              }
              local_548 = local_548 + 1;
              local_498 = local_498 + 1;
              local_488._0_4_ = (int)local_488 + 1;
              lVar41 = lVar41 + 8;
              iVar45 = iVar45 + 1;
              lVar50 = lVar50 + 8;
              lVar32 = lVar32 + 8;
            } while (local_40c[0] + 1 != (int)local_548);
          }
          local_668 = local_668 + 1;
          piVar52 = piVar52 + local_a8;
          local_5d8 = local_5d8 + lVar49;
          lVar44 = lVar44 + lVar49;
          local_5e0 = local_5e0 + lVar49;
          lVar51 = lVar51 + lVar49;
          local_4d8 = (int *)((long)local_4d8 + lVar49);
          lVar59 = lVar59 + lVar49;
        } while (local_40c[1] + 1 != (int)local_668);
      }
      local_558 = local_558 + 1;
      local_640 = local_640 + local_a0;
      local_4e8 = local_4e8 + lVar36;
      local_4b8 = local_4b8 + lVar36;
      iVar62 = iVar62 + 1;
    } while ((int)uStack_404 + 1 != (int)local_558);
  }
  local_558 = (long)(int)uStack_610;
  if ((int)uStack_610 <= (int)uStack_424) {
    lVar42 = (long)(int)local_618._4_4_;
    lVar47 = (long)(int)(uint)local_618;
    lVar30 = lVar35 * (long)local_118 * 8 + (local_558 - local_108) * (long)local_120 * 8;
    lVar36 = lVar30 + (lVar42 - (int)local_10c) * local_128 * 8;
    local_638 = lVar30 + local_130;
    local_5a8 = lVar30 + lVar47 * 8 + (long)(int)local_110 * -8 + local_130;
    lVar46 = lVar36 + local_130;
    lVar36 = lVar36 + lVar47 * 8 + (long)(int)local_110 * -8 + local_130;
    piVar52 = (int *)((local_558 - local_48) * local_60 * 4 + (lVar42 - local_4c) * local_68 * 4 +
                      local_58 * lVar35 * 4 + lVar47 * 4 + (long)local_50 * -4 + local_70);
    lVar30 = (long)local_120 * 8;
    lVar35 = local_128 * 8;
    do {
      local_668 = lVar42;
      local_650 = piVar52;
      local_628 = lVar36;
      local_5d8 = lVar46;
      iVar28 = ~local_10c + local_618._4_4_;
      iVar62 = local_618._4_4_ - local_10c;
      if ((int)local_618._4_4_ <= (int)local_42c[1]) {
        do {
          iVar62 = iVar62 + 1;
          if ((int)(uint)local_618 <= (int)local_42c[0]) {
            lVar49 = local_5a8 + iVar62 * lVar35;
            lVar51 = local_5a8 + iVar28 * lVar35;
            lVar44 = iVar62 * lVar35 + local_638;
            lVar32 = iVar28 * lVar35 + local_638;
            local_488._0_4_ = ((uint)local_618 - local_110) + 1;
            local_498 = local_650;
            lVar59 = local_628;
            local_548 = lVar47;
            iVar45 = ~local_110 + (uint)local_618;
            do {
              if (0 < (int)local_588) {
                lVar41 = (long)(int)local_488;
                lVar37 = (long)iVar45;
                iVar66 = ratio->vect[1] * (int)local_668;
                lVar55 = (long)((iVar66 - local_26c) + 1) * local_288 * 8;
                iVar54 = ratio->vect[0] * (int)local_548;
                lVar58 = (long)((iVar54 - local_270) + 1);
                lVar50 = lVar29 * 8 * local_278 +
                         ((long)(ratio->vect[2] * (int)local_558) - (long)local_268) * local_280 * 8
                         + local_290;
                lVar60 = ((long)iVar66 - (long)local_26c) * local_288 * 8;
                lVar48 = 0;
                piVar38 = local_498;
                uVar43 = uVar31;
                do {
                  if ((local_70 == 0) || (*piVar38 != 0)) {
                    dVar82 = *(double *)(lVar32 + lVar37 * 8 + lVar48);
                    dVar77 = *(double *)(lVar51 + lVar48);
                    dVar86 = *(double *)(lVar32 + lVar41 * 8 + lVar48);
                    dVar4 = *(double *)(local_5d8 + lVar37 * 8 + lVar48);
                    dVar94 = *(double *)(local_5d8 + lVar41 * 8 + lVar48);
                    dVar74 = *(double *)(lVar44 + lVar37 * 8 + lVar48);
                    dVar79 = *(double *)(lVar49 + lVar48);
                    dVar81 = *(double *)(lVar44 + lVar41 * 8 + lVar48);
                    dVar83 = *(double *)(lVar59 + lVar48) * 64.0;
                    dVar88 = ((dVar82 + dVar81) - dVar74) - dVar86;
                    *(double *)(lVar50 + lVar60 + (long)iVar54 * 8 + (long)local_270 * -8) =
                         ((((dVar77 + dVar4) - dVar79) - dVar94) * 8.0 + dVar83 + dVar88) * 0.015625
                    ;
                    dVar81 = ((dVar86 + dVar74) - dVar82) - dVar81;
                    *(double *)(lVar50 + lVar60 + lVar58 * 8) =
                         ((((dVar77 + dVar94) - dVar79) - dVar4) * 8.0 + dVar83 + dVar81) * 0.015625
                    ;
                    *(double *)(lVar50 + lVar55 + (long)iVar54 * 8 + (long)local_270 * -8) =
                         ((((dVar4 + dVar79) - dVar77) - dVar94) * 8.0 + dVar83 + dVar81) * 0.015625
                    ;
                    *(double *)(lVar50 + lVar55 + lVar58 * 8) =
                         ((((dVar94 + dVar79) - dVar77) - dVar4) * 8.0 + dVar83 + dVar88) * 0.015625
                    ;
                  }
                  lVar50 = lVar50 + local_278 * 8;
                  piVar38 = piVar38 + local_58;
                  lVar48 = lVar48 + (long)local_118 * 8;
                  uVar43 = uVar43 - 1;
                } while (uVar43 != 0);
              }
              local_548 = local_548 + 1;
              local_498 = local_498 + 1;
              local_488._0_4_ = (int)local_488 + 1;
              lVar49 = lVar49 + 8;
              iVar45 = iVar45 + 1;
              lVar59 = lVar59 + 8;
              lVar51 = lVar51 + 8;
            } while (local_42c[0] + 1 != (int)local_548);
          }
          local_668 = local_668 + 1;
          local_650 = local_650 + local_68;
          local_5d8 = local_5d8 + lVar35;
          local_628 = local_628 + lVar35;
          iVar28 = iVar28 + 1;
        } while (local_42c[1] + 1 != (int)local_668);
      }
      local_558 = local_558 + 1;
      piVar52 = piVar52 + local_60;
      local_638 = local_638 + lVar30;
      local_5a8 = local_5a8 + lVar30;
      lVar46 = lVar46 + lVar30;
      lVar36 = lVar36 + lVar30;
    } while ((int)uStack_424 + 1 != (int)local_558);
  }
  if (0 < (int)local_588) {
    iVar28 = ratio->vect[1];
    lVar59 = (long)iVar28;
    iVar62 = ratio->vect[0];
    lVar47 = (long)local_2f0[1];
    lVar49 = (int)local_618._4_4_ * lVar59;
    lVar35 = lVar49 + 1;
    lVar30 = local_278 * lVar29 * 8;
    lVar46 = (long)(int)(uint)local_618 * (long)iVar62;
    lVar42 = lVar30 + (lVar35 - local_26c) * local_288 * 8 + lVar46 * 8 + (long)local_270 * -8;
    lVar30 = lVar30 + (lVar49 - local_26c) * local_288 * 8 + lVar46 * 8 + (long)local_270 * -8;
    lVar36 = local_310[3] * lVar29 * 8;
    local_338._0_8_ = local_290 + lVar42;
    local_340 = (undefined1  [8])(lVar42 + local_290 + 8);
    local_348 = local_290 + lVar30;
    local_350 = local_290 + lVar30 + 8;
    lVar30 = local_2b8 * lVar29 * 8;
    lVar42 = (long)local_2b0;
    local_358 = lVar30 + (lVar35 - local_2ac) * local_2c8 * 8 + lVar46 * 8 + lVar42 * -8 + local_2d0
    ;
    local_360 = lVar30 + lVar42 * -8 + local_2d0 + 8;
    local_3d0 = lVar30 + (lVar49 - local_2ac) * local_2c8 * 8 + lVar46 * 8 + lVar42 * -8 + 8 +
                local_2d0;
    dVar83 = dVar80 * dVar80;
    dVar86 = dVar71 * dVar71;
    dVar94 = dVar87 * dVar87;
    dVar84 = (dVar87 + dVar87) * dVar87;
    dVar74 = dVar71 * 8.0 * (dVar94 + dVar83);
    dVar81 = dVar87 * 8.0 * (dVar83 + dVar86);
    dVar82 = (dVar71 + dVar71) * dVar71;
    dVar77 = dVar80 * 8.0 * (dVar86 + dVar94);
    dVar85 = (dVar80 + dVar80) * dVar80;
    dVar88 = ((dVar83 + dVar82) * dVar80) / dVar81;
    dVar91 = (dVar80 * dVar83) / dVar81;
    dVar79 = ((dVar84 + dVar86) * dVar71) / dVar77;
    dVar92 = (dVar71 * dVar86) / dVar77;
    dVar4 = ((dVar86 + dVar85) * dVar71) / dVar81;
    dVar81 = (dVar71 * dVar86) / dVar81;
    dVar71 = ((dVar82 + dVar94) * dVar87) / dVar77;
    dVar77 = (dVar87 * dVar94) / dVar77;
    dVar82 = ((dVar84 + dVar83) * dVar80) / dVar74;
    dVar80 = (dVar80 * dVar83) / dVar74;
    dVar86 = ((dVar85 + dVar94) * dVar87) / dVar74;
    dVar74 = (dVar87 * dVar94) / dVar74;
    auVar19._8_4_ = SUB84(dVar4,0);
    auVar19._0_8_ = dVar4;
    auVar19._12_4_ = (int)((ulong)dVar4 >> 0x20);
    lVar30 = local_278 * 8;
    lVar51 = local_280 * 8;
    iVar45 = uStack_610 * iVar28;
    lVar44 = local_288 * lVar59 * 8;
    lVar41 = local_2b8 * 8;
    lVar32 = local_2c8 * lVar59 * 8;
    local_368 = lVar36 + (lVar35 - lVar47) * local_310[1] * 8 + lVar46 * 8 + (long)local_2f0[0] * -8
                + local_310[0] + 8;
    lVar35 = -(long)local_2f0[2];
    lVar42 = local_310[1] * lVar59 * 8;
    local_370 = lVar36 + (lVar49 - lVar47) * local_310[1] * 8 + lVar46 * 8 + (long)local_2f0[0] * -8
                + local_310[0] + 8;
    local_3d8 = 0;
    do {
      if ((int)uStack_610 <= (int)(uint)uStack_604) {
        lVar36 = (lVar29 + local_3d8) * local_310[3];
        local_4f4 = (iVar45 - local_268) + 2;
        local_4f0 = iVar45;
        local_4ec = iVar45 + 1;
        uVar39 = uStack_610;
        do {
          if ((int)local_618._4_4_ <= (int)auStack_60c[1]) {
            lVar49 = local_338._0_8_ + local_4f4 * lVar51;
            lVar37 = (long)local_4f0;
            lVar68 = (-(long)local_268 + lVar37) * lVar51;
            lVar55 = local_338._0_8_ + lVar68;
            lVar56 = (-(long)local_2a8 + lVar37) * local_2c0 * 8;
            lVar69 = local_4f4 * lVar51 + local_348;
            lVar68 = lVar68 + local_348;
            lVar48 = (long)local_4ec;
            lVar63 = (lVar35 + lVar48) * local_310[2] * 8;
            lVar50 = local_368 + lVar63;
            lVar65 = (lVar37 + lVar35) * local_310[2] * 8;
            lVar37 = local_368 + lVar65;
            lVar63 = lVar63 + local_370;
            lVar65 = lVar65 + local_370;
            lVar64 = (-(long)local_268 + lVar48) * lVar51;
            local_620 = (long)local_340 + lVar64;
            lVar64 = lVar64 + local_350;
            lVar53 = (lVar48 + -(long)local_2a8) * local_2c0 * 8;
            local_630 = local_3d0 + lVar53;
            lVar61 = ((long)(int)(uVar39 * iVar28) - (long)local_2f0[2]) * local_310[2];
            lVar58 = (int)((uVar39 * iVar28 - local_2f0[2]) + 1) * local_310[2];
            lVar48 = local_358 + lVar53;
            local_628 = local_358 + lVar56;
            lVar60 = local_3d0 + lVar56;
            local_55c = (local_618._4_4_ * iVar28 - local_2ac) + 2;
            local_3b8 = (long)(int)local_618._4_4_;
            do {
              if ((int)(uint)local_618 <= (int)auStack_60c[0]) {
                lVar33 = local_55c * local_2c8 + lVar46;
                lVar1 = lVar53 + local_360 + lVar33 * 8;
                lVar33 = lVar56 + local_360 + lVar33 * 8;
                lVar34 = local_3b8 * lVar59 - lVar47;
                lVar57 = 0;
                iVar54 = ((uint)local_618 * iVar62 - local_2f0[0]) + 2;
                iVar66 = (auStack_60c[0] - (uint)local_618) + 1;
                do {
                  lVar2 = local_310[0] + lVar34 * local_310[1] * 8 + (long)iVar54 * 8;
                  dVar87 = *(double *)(lVar2 + lVar61 * 8 + lVar36 * 8);
                  lVar3 = local_310[0] + (lVar34 + 1) * local_310[1] * 8 + (long)iVar54 * 8;
                  dVar94 = *(double *)(lVar3 + lVar61 * 8 + lVar36 * 8);
                  dVar83 = *(double *)(lVar65 + -8 + lVar57);
                  dVar84 = *(double *)(lVar37 + -8 + lVar57);
                  dVar85 = *(double *)(lVar60 + -8 + lVar57);
                  dVar5 = *(double *)(lVar60 + lVar57);
                  dVar73 = *(double *)(lVar33 + -8 + lVar57);
                  dVar96 = *(double *)(lVar33 + lVar57);
                  dVar6 = *(double *)(local_630 + -8 + lVar57);
                  dVar7 = *(double *)(local_630 + lVar57);
                  dVar8 = *(double *)(lVar1 + -8 + lVar57);
                  dVar9 = *(double *)(lVar1 + lVar57);
                  dVar89 = ((dVar85 + dVar96) - dVar73) - dVar5;
                  dVar17 = dVar82 * dVar89;
                  auVar15._8_4_ = SUB84(dVar6,0);
                  auVar15._0_8_ = dVar85;
                  auVar15._12_4_ = (int)((ulong)dVar6 >> 0x20);
                  dVar75 = ((dVar6 + dVar9) - dVar8) - dVar7;
                  dVar18 = dVar80 * dVar75;
                  dVar10 = *(double *)(lVar3 + lVar58 * 8 + lVar36 * 8);
                  dVar11 = *(double *)(lVar63 + -8 + lVar57);
                  dVar12 = *(double *)(lVar50 + -8 + lVar57);
                  dVar13 = *(double *)(lVar2 + lVar58 * 8 + lVar36 * 8);
                  dVar75 = dVar75 * dVar82;
                  dVar89 = dVar89 * dVar80;
                  dVar78 = ((dVar11 + dVar10) - dVar12) - dVar13;
                  dVar93 = SUB168(*(undefined1 (*) [16])(lVar69 + lVar57),0);
                  dVar95 = SUB168(*(undefined1 (*) [16])(lVar69 + lVar57),8);
                  dVar22 = *(double *)(lVar68 + lVar57);
                  dVar23 = ((double *)(lVar68 + lVar57))[1];
                  dVar20 = ((dVar22 + dVar95) - dVar93) - dVar23;
                  dVar72 = dVar88 * dVar20;
                  dVar24 = *(double *)(lVar49 + lVar57);
                  dVar25 = ((double *)(lVar49 + lVar57))[1];
                  dVar26 = *(double *)(lVar55 + lVar57);
                  dVar27 = ((double *)(lVar55 + lVar57))[1];
                  dVar90 = ((dVar26 + dVar25) - dVar24) - dVar27;
                  dVar76 = dVar91 * dVar90;
                  *(double *)(lVar65 + lVar57) =
                       (dVar83 + dVar87) * 0.5 + dVar17 + dVar18 + dVar72 + dVar76;
                  dVar90 = dVar90 * dVar88;
                  *(double *)(lVar37 + lVar57) =
                       (((dVar22 + dVar95) - dVar23) - dVar93) * dVar91 +
                       (dVar84 + dVar94) * 0.5 + dVar17 + dVar18 + dVar90;
                  *(double *)(lVar63 + lVar57) =
                       dVar72 + (dVar11 + dVar13) * 0.5 + dVar75 + dVar89 + dVar76;
                  dStack_4b0 = auVar19._8_8_;
                  *(double *)(lVar50 + lVar57) =
                       dVar20 * dVar91 + dVar90 + (dVar12 + dVar10) * 0.5 + dVar75 + dVar89;
                  dVar18 = ((dVar85 + dVar8) - dVar6) - dVar73;
                  dStack_480 = auVar15._8_8_;
                  dVar75 = ((dVar83 + dVar94) - dVar84) - dVar87;
                  dVar20 = dVar79 * dVar75;
                  dVar72 = dVar79 * dVar78;
                  dVar6 = ((dVar22 + dVar24) - dVar93) - dVar26;
                  dVar17 = ((dVar23 + dVar25) - dVar95) - dVar27;
                  *(double *)(local_628 + lVar57) =
                       dVar81 * dVar17 +
                       dVar4 * dVar6 + dVar78 * dVar92 + (dVar73 + dVar85) * 0.5 + dVar20;
                  ((double *)(local_628 + lVar57))[1] =
                       dVar81 * dVar6 +
                       dStack_4b0 * dVar17 + dVar78 * dVar92 + (dVar8 + dStack_480) * 0.5 + dVar20;
                  dVar85 = dVar6 * dVar81 +
                           dVar17 * dVar4 + dVar75 * dVar92 + (dVar9 + dVar7) * 0.5 + dVar72;
                  auVar16._8_4_ = SUB84(dVar85,0);
                  auVar16._0_8_ =
                       dVar17 * dVar81 +
                       dVar6 * dStack_4b0 + dVar75 * dVar92 + (dVar96 + dVar5) * 0.5 + dVar72;
                  auVar16._12_4_ = (int)((ulong)dVar85 >> 0x20);
                  *(undefined1 (*) [16])(lVar48 + lVar57) = auVar16;
                  dVar87 = ((dVar83 + dVar13) - dVar11) - dVar87;
                  dVar73 = dVar71 * dVar87;
                  dVar94 = ((dVar84 + dVar10) - dVar12) - dVar94;
                  dVar85 = dVar77 * dVar94;
                  dVar83 = dVar86 * dVar18;
                  dVar96 = ((dVar5 + dVar9) - dVar7) - dVar96;
                  dVar84 = dVar74 * dVar96;
                  *(double *)(lVar64 + -8 + lVar57) =
                       (dVar22 + dVar93) * 0.5 + dVar73 + dVar85 + dVar83 + dVar84;
                  dVar96 = dVar96 * dVar86;
                  dVar18 = dVar18 * dVar74;
                  *(double *)(local_620 + -8 + lVar57) =
                       (dVar26 + dVar24) * 0.5 + dVar73 + dVar85 + dVar96 + dVar18;
                  dVar94 = dVar94 * dVar71;
                  dVar87 = dVar87 * dVar77;
                  *(double *)(lVar64 + lVar57) =
                       (dVar23 + dVar95) * 0.5 + dVar94 + dVar87 + dVar83 + dVar84;
                  *(double *)(local_620 + lVar57) =
                       (dVar27 + dVar25) * 0.5 + dVar94 + dVar87 + dVar96 + dVar18;
                  iVar54 = iVar54 + iVar62;
                  lVar57 = lVar57 + (long)iVar62 * 8;
                  iVar66 = iVar66 + -1;
                } while (iVar66 != 0);
              }
              local_3b8 = local_3b8 + 1;
              lVar49 = lVar49 + lVar44;
              lVar55 = lVar55 + lVar44;
              local_628 = local_628 + lVar32;
              lVar69 = lVar69 + lVar44;
              lVar68 = lVar68 + lVar44;
              lVar50 = lVar50 + lVar42;
              lVar37 = lVar37 + lVar42;
              lVar63 = lVar63 + lVar42;
              lVar65 = lVar65 + lVar42;
              local_620 = local_620 + lVar44;
              lVar64 = lVar64 + lVar44;
              local_55c = local_55c + iVar28;
              local_630 = local_630 + lVar32;
              lVar60 = lVar60 + lVar32;
              lVar48 = lVar48 + lVar32;
            } while (auStack_60c[1] + 1 != (int)local_3b8);
          }
          local_4f4 = local_4f4 + iVar28;
          local_4f0 = local_4f0 + iVar28;
          local_4ec = local_4ec + iVar28;
          bVar70 = uVar39 != (uint)uStack_604;
          uVar39 = uVar39 + 1;
        } while (bVar70);
      }
      local_3d8 = local_3d8 + 1;
      local_338._0_8_ = local_338._0_8_ + lVar30;
      local_358 = local_358 + lVar41;
      local_348 = local_348 + lVar30;
      local_368 = local_368 + local_310[3] * 8;
      local_370 = local_370 + local_310[3] * 8;
      local_340 = (undefined1  [8])((long)local_340 + lVar30);
      local_350 = local_350 + lVar30;
      local_360 = local_360 + lVar41;
      local_3d0 = local_3d0 + lVar41;
    } while (local_3d8 != uVar31);
  }
  return;
}

Assistant:

void
FaceDivFree::interp_arr (Array<FArrayBox*, AMREX_SPACEDIM> const& crse,
                         const int         crse_comp,
                         Array<FArrayBox*, AMREX_SPACEDIM> const& fine,
                         const int         fine_comp,
                         const int         ncomp,
                         const Box&        fine_region,
                         const IntVect&    ratio,
                         Array<IArrayBox*, AMREX_SPACEDIM> const& solve_mask,
                         const Geometry&   /*crse_geom */,
                         const Geometry&   fine_geom,
                         Vector<Array<BCRec, AMREX_SPACEDIM> > const& /*bcr*/,
                         const int         /*actual_comp*/,
                         const int         /*actual_state*/,
                         const RunOn       runon)
{
    BL_PROFILE("FaceDivFree::interp()");

    Array<IndexType, AMREX_SPACEDIM> types;
    for (int d=0; d<AMREX_SPACEDIM; ++d)
        { types[d].set(d); }

    // This is currently only designed for octree, where ratio = 2.
    AMREX_ALWAYS_ASSERT(ratio == 2);

    const Box c_fine_region = amrex::coarsen(fine_region, ratio);
    GpuArray<Real, AMREX_SPACEDIM> cell_size = fine_geom.CellSizeArray();

    GpuArray<Array4<const Real>, AMREX_SPACEDIM> crsearr;
    GpuArray<Array4<Real>, AMREX_SPACEDIM> finearr;
    GpuArray<Array4<const int>, AMREX_SPACEDIM> maskarr;
    for (int d=0; d<AMREX_SPACEDIM; ++d)
    {
        crsearr[d] = crse[d]->const_array(crse_comp);
        finearr[d] = fine[d]->array(fine_comp);
        if (solve_mask[d] != nullptr)
            { maskarr[d] = solve_mask[d]->const_array(0); }
    }

    // Fuse the launches, 1 for each dimension, into a single launch.
    AMREX_LAUNCH_HOST_DEVICE_LAMBDA_DIM_FLAG(runon,
              amrex::convert(c_fine_region,types[0]), bx0,
              {
                  AMREX_LOOP_3D(bx0, i, j, k,
                  {
                      for (int n=0; n<ncomp; ++n)
                      {
                          amrex::facediv_face_interp<Real> (i,j,k,crse_comp+n,fine_comp+n, 0,
                                                            crsearr[0], finearr[0], maskarr[0], ratio);
                      }
                  });
              },
              amrex::convert(c_fine_region,types[1]), bx1,
              {
                  AMREX_LOOP_3D(bx1, i, j, k,
                  {
                      for (int n=0; n<ncomp; ++n)
                      {
                          amrex::facediv_face_interp<Real> (i,j,k,crse_comp+n,fine_comp+n, 1,
                                                            crsearr[1], finearr[1], maskarr[1], ratio);
                      }
                  });
              },
              amrex::convert(c_fine_region,types[2]), bx2,
              {
                  AMREX_LOOP_3D(bx2, i, j, k,
                  {
                      for (int n=0; n<ncomp; ++n)
                      {
                          amrex::facediv_face_interp<Real> (i,j,k,crse_comp+n,fine_comp+n, 2,
                                                            crsearr[2], finearr[2], maskarr[2], ratio);
                      }
                  });
              });

    AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(runon,c_fine_region,ncomp,i,j,k,n,
    {
        amrex::facediv_int<Real>(i, j, k, fine_comp+n, finearr, ratio, cell_size);
    });
}